

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Serializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP4Serializer::MakeHeader
          (BP4Serializer *this,BufferSTL *b,string *fileType,bool isActive)

{
  bool bVar1;
  size_t sVar2;
  byte in_CL;
  ulong in_RDX;
  long in_RSI;
  uint8_t activeFlag;
  uint8_t version;
  uint8_t endianness;
  size_t versionLongTagSize;
  string fileTypeStr;
  size_t maxTypeLen;
  string versionLongTag;
  string patchVersion;
  string minorVersion;
  char minorVersionChar;
  string majorVersion;
  size_t *absolutePosition;
  size_t *position;
  vector<char,_std::allocator<char>_> *buffer;
  anon_class_1_0_00000001 lf_CopyVersionChar;
  BufferSTL *in_stack_fffffffffffff950;
  allocator *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff958;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffff960;
  string *in_stack_fffffffffffff968;
  anon_class_1_0_00000001 *in_stack_fffffffffffff970;
  allocator *in_stack_fffffffffffff978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff990;
  string *in_stack_fffffffffffff998;
  string *in_stack_fffffffffffff9a0;
  string *in_stack_fffffffffffff9a8;
  string *in_stack_fffffffffffff9b0;
  allocator local_5b9;
  string local_5b8 [39];
  allocator local_591;
  string *in_stack_fffffffffffffa70;
  size_t in_stack_fffffffffffffa78;
  BufferSTL *in_stack_fffffffffffffa80;
  allocator local_569;
  string local_568 [39];
  allocator local_541;
  string local_540 [38];
  undefined1 local_51a;
  allocator local_519;
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [39];
  undefined1 local_4c9 [40];
  undefined1 local_4a1 [39];
  undefined1 local_47a;
  undefined1 local_479 [40];
  undefined1 local_451 [40];
  undefined1 local_429 [40];
  undefined1 local_401 [33];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  ulong local_380;
  string local_378 [32];
  long local_358;
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [39];
  allocator local_289;
  string local_288 [39];
  allocator local_261;
  string local_260 [39];
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [32];
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [39];
  undefined1 local_1a1;
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  long *local_38;
  long *local_30;
  string *local_28;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_28 = (string *)(in_RSI + 0x40);
  local_30 = (long *)(in_RSI + 0x30);
  local_38 = (long *)(in_RSI + 0x38);
  if (*local_30 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"Toolkit",&local_59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"format::bp::BP4Serializer",&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"MakeHeader",&local_b9);
    std::operator+((char *)in_stack_fffffffffffff998,in_stack_fffffffffffff990);
    std::operator+(in_stack_fffffffffffff958,(char *)in_stack_fffffffffffff950);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff988);
    std::operator+(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
    std::operator+(in_stack_fffffffffffff958,(char *)in_stack_fffffffffffff950);
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               in_stack_fffffffffffff998,(int)((ulong)in_stack_fffffffffffff990 >> 0x20));
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  sVar2 = BufferSTL::GetAvailableSize(in_stack_fffffffffffff950);
  if (sVar2 < 0x40) {
    std::operator+((char *)in_stack_fffffffffffff998,in_stack_fffffffffffff990);
    BufferSTL::Resize(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,in_stack_fffffffffffffa70)
    ;
    std::__cxx11::string::~string(local_180);
  }
  std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff998 >> 0x20));
  local_1a1 = 0x3a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,1,':',&local_1c9);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff998 >> 0x20));
  if (*local_30 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_210,"Toolkit",&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"format::bp::BP4Serializer",&local_239);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_260,"MakeHeader",&local_261);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_288,"Version Tag position mismatch",&local_289);
    helper::Throw<std::runtime_error>
              (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               in_stack_fffffffffffff998,(int)((ulong)in_stack_fffffffffffff990 >> 0x20));
    std::__cxx11::string::~string(local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    std::__cxx11::string::~string(local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
  }
  std::operator+((char *)in_stack_fffffffffffff998,in_stack_fffffffffffff990);
  std::operator+(in_stack_fffffffffffff958,(char *)in_stack_fffffffffffff950);
  std::operator+(in_stack_fffffffffffff958,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff950);
  std::operator+(in_stack_fffffffffffff958,(char *)in_stack_fffffffffffff950);
  std::operator+(in_stack_fffffffffffff958,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff950);
  std::operator+(in_stack_fffffffffffff958,(char *)in_stack_fffffffffffff950);
  std::__cxx11::string::~string(local_2d0);
  std::__cxx11::string::~string(local_2f0);
  std::__cxx11::string::~string(local_310);
  std::__cxx11::string::~string(local_330);
  std::__cxx11::string::~string(local_350);
  local_358 = std::__cxx11::string::size();
  local_358 = 0x20 - local_358;
  std::__cxx11::string::substr((ulong)local_378,in_RDX);
  std::__cxx11::string::operator+=(local_2b0,local_378);
  local_380 = std::__cxx11::string::size();
  if (local_380 < 0x20) {
    std::__cxx11::string::c_str();
    helper::CopyToBuffer<char>
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff990,
               (size_t *)in_stack_fffffffffffff988,(char *)in_stack_fffffffffffff980,
               (size_t)in_stack_fffffffffffff978);
    *local_30 = (0x20 - local_380) + *local_30;
  }
  else if (local_380 < 0x21) {
    in_stack_fffffffffffff9b0 = local_28;
    std::__cxx11::string::c_str();
    helper::CopyToBuffer<char>
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff990,
               (size_t *)in_stack_fffffffffffff988,(char *)in_stack_fffffffffffff980,
               (size_t)in_stack_fffffffffffff978);
  }
  else {
    std::__cxx11::string::c_str();
    helper::CopyToBuffer<char>
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff990,
               (size_t *)in_stack_fffffffffffff988,(char *)in_stack_fffffffffffff980,
               (size_t)in_stack_fffffffffffff978);
  }
  std::__cxx11::string::string(local_3a0,local_1a0);
  MakeHeader::anon_class_1_0_00000001::operator()
            (in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960,
             (size_t *)in_stack_fffffffffffff958);
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::string::string(local_3c0,local_1c8);
  MakeHeader::anon_class_1_0_00000001::operator()
            (in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960,
             (size_t *)in_stack_fffffffffffff958);
  std::__cxx11::string::~string(local_3c0);
  std::__cxx11::string::string(local_3e0,local_1f0);
  MakeHeader::anon_class_1_0_00000001::operator()
            (in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960,
             (size_t *)in_stack_fffffffffffff958);
  std::__cxx11::string::~string(local_3e0);
  *local_30 = *local_30 + 1;
  if (*local_30 != 0x24) {
    in_stack_fffffffffffff9a8 = (string *)local_401;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_401 + 1),"Toolkit",(allocator *)in_stack_fffffffffffff9a8);
    in_stack_fffffffffffff9a0 = (string *)local_429;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_429 + 1),"format::bp::BP4Serializer",
               (allocator *)in_stack_fffffffffffff9a0);
    in_stack_fffffffffffff998 = (string *)local_451;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_451 + 1),"MakeHeader",(allocator *)in_stack_fffffffffffff998);
    in_stack_fffffffffffff990 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_479;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_479 + 1),"Endian Flag position mismatch",
               (allocator *)in_stack_fffffffffffff990);
    helper::Throw<std::runtime_error>
              (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               in_stack_fffffffffffff998,(int)((ulong)in_stack_fffffffffffff990 >> 0x20));
    std::__cxx11::string::~string((string *)(local_479 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_479);
    std::__cxx11::string::~string((string *)(local_451 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_451);
    std::__cxx11::string::~string((string *)(local_429 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_429);
    std::__cxx11::string::~string((string *)(local_401 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_401);
  }
  bVar1 = helper::IsLittleEndian();
  local_47a = !bVar1;
  helper::CopyToBuffer<unsigned_char>
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff990,
             (size_t *)in_stack_fffffffffffff988,(uchar *)in_stack_fffffffffffff980,
             (size_t)in_stack_fffffffffffff978);
  if (*local_30 != 0x25) {
    in_stack_fffffffffffff988 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_4a1 + 1),"Toolkit",(allocator *)in_stack_fffffffffffff988);
    in_stack_fffffffffffff980 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_4c9 + 1),"format::bp::BP4Serializer",
               (allocator *)in_stack_fffffffffffff980);
    in_stack_fffffffffffff978 = &local_4f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4f0,"MakeHeader",in_stack_fffffffffffff978);
    paVar3 = &local_519;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_518,"Active Flag position mismatch",paVar3);
    helper::Throw<std::runtime_error>
              (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               in_stack_fffffffffffff998,(int)((ulong)in_stack_fffffffffffff990 >> 0x20));
    std::__cxx11::string::~string(local_518);
    std::allocator<char>::~allocator((allocator<char> *)&local_519);
    std::__cxx11::string::~string(local_4f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
    std::__cxx11::string::~string((string *)(local_4c9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_4c9);
    std::__cxx11::string::~string((string *)(local_4a1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_4a1);
  }
  local_51a = 4;
  helper::CopyToBuffer<unsigned_char>
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff990,
             (size_t *)in_stack_fffffffffffff988,(uchar *)in_stack_fffffffffffff980,
             (size_t)in_stack_fffffffffffff978);
  if (*local_30 != 0x26) {
    paVar3 = &local_541;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_540,"Toolkit",paVar3);
    paVar3 = &local_569;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_568,"format::bp::BP4Serializer",paVar3);
    paVar3 = &local_591;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffa70,"MakeHeader",paVar3);
    paVar3 = &local_5b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5b8,"Active Flag position mismatch",paVar3);
    helper::Throw<std::runtime_error>
              (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               in_stack_fffffffffffff998,(int)((ulong)in_stack_fffffffffffff990 >> 0x20));
    std::__cxx11::string::~string(local_5b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffa70);
    std::allocator<char>::~allocator((allocator<char> *)&local_591);
    std::__cxx11::string::~string(local_568);
    std::allocator<char>::~allocator((allocator<char> *)&local_569);
    std::__cxx11::string::~string(local_540);
    std::allocator<char>::~allocator((allocator<char> *)&local_541);
  }
  helper::CopyToBuffer<unsigned_char>
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff990,
             (size_t *)in_stack_fffffffffffff988,(uchar *)in_stack_fffffffffffff980,
             (size_t)in_stack_fffffffffffff978);
  *local_30 = *local_30 + 1;
  *local_30 = *local_30 + 0x18;
  *local_38 = *local_30;
  std::__cxx11::string::~string(local_378);
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::~string(local_1a0);
  return;
}

Assistant:

void BP4Serializer::MakeHeader(BufferSTL &b, const std::string fileType, const bool isActive)
{
    auto lf_CopyVersionChar = [](const std::string version, std::vector<char> &buffer,
                                 size_t &position) {
        helper::CopyToBuffer(buffer, position, version.c_str());
    };

    auto &buffer = b.m_Buffer;
    auto &position = b.m_Position;
    auto &absolutePosition = b.m_AbsolutePosition;
    if (position > 0)
    {
        helper::Throw<std::invalid_argument>("Toolkit", "format::bp::BP4Serializer", "MakeHeader",
                                             "can only be called for an empty "
                                             "buffer. This one for " +
                                                 fileType + " already has content of " +
                                                 std::to_string(position) + " bytes.");
    }

    if (b.GetAvailableSize() < 64)
    {
        b.Resize(position + 64, "BP4Serializer::MakeHeader " + fileType);
    }

    const std::string majorVersion(std::to_string(ADIOS2_VERSION_MAJOR));
    const char minorVersionChar = '0' + ADIOS2_VERSION_MINOR;
    const std::string minorVersion(1, minorVersionChar);
    const std::string patchVersion(std::to_string(ADIOS2_VERSION_PATCH));

    // byte 0-31: Readable tag
    if (position != m_VersionTagPosition)
    {
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP4Serializer", "MakeHeader",
                                          "Version Tag "
                                          "position mismatch");
    }
    std::string versionLongTag("ADIOS-BP v" + majorVersion + "." + minorVersion + "." +
                               patchVersion + " ");
    size_t maxTypeLen = m_VersionTagLength - versionLongTag.size();
    const std::string fileTypeStr = fileType.substr(0, maxTypeLen);
    versionLongTag += fileTypeStr;
    const size_t versionLongTagSize = versionLongTag.size();
    if (versionLongTagSize < m_VersionTagLength)
    {
        helper::CopyToBuffer(buffer, position, versionLongTag.c_str(), versionLongTagSize);
        position += m_VersionTagLength - versionLongTagSize;
    }
    else if (versionLongTagSize > m_VersionTagLength)
    {
        helper::CopyToBuffer(buffer, position, versionLongTag.c_str(), m_VersionTagLength);
    }
    else
    {
        helper::CopyToBuffer(buffer, position, versionLongTag.c_str(), m_VersionTagLength);
    }

    // byte 32-35: MAJOR MINOR PATCH Unused

    lf_CopyVersionChar(majorVersion, buffer, position);
    lf_CopyVersionChar(minorVersion, buffer, position);
    lf_CopyVersionChar(patchVersion, buffer, position);
    ++position;

    // Note: Reader does process and use bytes 36-38 in
    // BP4Deserialize.cpp::ParseMetadataIndex().
    // Order and position must match there.

    // byte 36: endianness
    if (position != m_EndianFlagPosition)
    {
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP4Serializer", "MakeHeader",
                                          "Endian Flag "
                                          "position mismatch");
    }
    const uint8_t endianness = helper::IsLittleEndian() ? 0 : 1;
    helper::CopyToBuffer(buffer, position, &endianness);

    // byte 37: BP Version 4
    if (position != m_BPVersionPosition)
    {
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP4Serializer", "MakeHeader",
                                          "Active Flag "
                                          "position mismatch");
    }
    const uint8_t version = 4;
    helper::CopyToBuffer(buffer, position, &version);

    // byte 38: Active flag (used in Index Table only)
    if (position != m_ActiveFlagPosition)
    {
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP4Serializer", "MakeHeader",
                                          "Active Flag "
                                          "position mismatch");
    }
    const uint8_t activeFlag = (isActive ? 1 : 0);
    helper::CopyToBuffer(buffer, position, &activeFlag);

    // byte 39: unused
    position += 1;

    // byte 40-63: unused
    position += 24;
    absolutePosition = position;
}